

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O2

ecs_table_t *
ecs_table_traverse_add
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_add,ecs_entities_t *added)

{
  int iVar1;
  ecs_entity_t *peVar2;
  ulong e;
  ecs_edge_t *peVar3;
  ecs_table_t *peVar4;
  ulong uVar5;
  ecs_table_t *node_00;
  ulong uVar6;
  ecs_entity_t *peVar7;
  ulong uVar8;
  ecs_entities_t owned;
  ecs_entity_t owned_array [32];
  
  node_00 = &(world->store).root;
  if (node != (ecs_table_t *)0x0) {
    node_00 = node;
  }
  peVar2 = to_add->array;
  owned.array = owned_array;
  owned.count = 0;
  uVar8 = 0;
  uVar6 = (ulong)(uint)to_add->count;
  if (to_add->count < 1) {
    uVar6 = uVar8;
  }
  while( true ) {
    if (uVar6 == uVar8) {
      if (owned.count != 0) {
        node_00 = ecs_table_traverse_add(world,node_00,&owned,added);
      }
      return node_00;
    }
    e = peVar2[uVar8];
    _ecs_assert(e != 0,2,(char *)0x0,"e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x279);
    if (e == 0) break;
    peVar3 = get_edge(node_00,e);
    peVar4 = peVar3->add;
    if (peVar4 == (ecs_table_t *)0x0) {
      peVar4 = find_or_create_table_include(world,node_00,e);
      _ecs_assert(peVar4 != (ecs_table_t *)0x0,0xc,(char *)0x0,"next != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x280);
      if (peVar4 == (ecs_table_t *)0x0) {
        __assert_fail("next != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                      ,0x280,
                      "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      peVar3->add = peVar4;
    }
    peVar7 = (ecs_entity_t *)0xff00000000000000;
    uVar5 = e & 0xff00000000000000;
    if ((added != (ecs_entities_t *)0x0) &&
       (peVar7 = (ecs_entity_t *)CONCAT71(0xfc000000000000,uVar5 != 0xfc00000000000000),
       uVar5 == 0xfc00000000000000 || node_00 != peVar4)) {
      peVar7 = added->array;
      iVar1 = added->count;
      added->count = iVar1 + 1;
      peVar7[iVar1] = e;
    }
    if (uVar5 == 0xfe00000000000000 && node_00 != peVar4) {
      find_owned_components
                (world,(ecs_table_t *)(e & 0xffffffffffffff),(ecs_entity_t)&owned,
                 (ecs_entities_t *)CONCAT71((int7)((ulong)peVar7 >> 8),node_00 == peVar4));
    }
    uVar8 = uVar8 + 1;
    node_00 = peVar4;
  }
  __assert_fail("e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x279,
                "ecs_table_t *ecs_table_traverse_add(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
               );
}

Assistant:

ecs_table_t* ecs_table_traverse_add(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_add,
    ecs_entities_t * added)    
{
    int32_t i, count = to_add->count;
    ecs_entity_t *entities = to_add->array;
    node = node ? node : &world->store.root;

    ecs_entity_t owned_array[ECS_MAX_ADD_REMOVE];
    ecs_entities_t owned = {
        .array = owned_array,
        .count = 0
    };    

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Adding 0 to an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->add;

        if (!next) {
            next = find_or_create_table_include(world, node, e);
            ecs_assert(next != NULL, ECS_INTERNAL_ERROR, NULL);
            edge->add = next;
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (added && (node != next || has_case)) {
            added->array[added->count ++] = e; 
        }

        if ((node != next) && ECS_HAS_ROLE(e, INSTANCEOF)) {
            find_owned_components(world, next, ECS_COMPONENT_MASK & e, &owned);
        }        

        node = next;
    }

    /* In case OWNED components were found, add them as well */
    if (owned.count) {
        node = ecs_table_traverse_add(world, node, &owned, added);
    }

    return node;
}